

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O0

void PatchOptimizeMaps::remove_useless_map_variants(World *world)

{
  initializer_list<unsigned_short> __l;
  bool bVar1;
  Map *pMVar2;
  reference puVar3;
  map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_> *pmVar4;
  reference __in;
  type *ppMVar5;
  type *flag;
  type *variant_map;
  _Self local_98;
  iterator __end2;
  iterator __begin2;
  map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_> *__range2;
  Map *map;
  const_iterator cStack_70;
  uint16_t map_id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  allocator<unsigned_short> local_47;
  unsigned_short local_46 [7];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> MAPS_TO_REMOVE_VARIANTS_FROM;
  World *world_local;
  
  local_46[0] = 0xe0;
  local_46[1] = 0x33;
  local_46[2] = 0x3b;
  local_46[3] = 0x37;
  local_46[4] = 0x4e;
  local_46[5] = 0x294;
  local_46[6] = 0x5e;
  local_38 = local_46;
  local_30 = 7;
  MAPS_TO_REMOVE_VARIANTS_FROM.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)world;
  std::allocator<unsigned_short>::allocator(&local_47);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28,__l,&local_47);
  std::allocator<unsigned_short>::~allocator(&local_47);
  pMVar2 = World::map((World *)MAPS_TO_REMOVE_VARIANTS_FROM.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,0x294);
  Map::map_setup_addr(pMVar2,0xffffffff);
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  cStack_70 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      (&__end1,&stack0xffffffffffffff90);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1);
    pMVar2 = World::map((World *)MAPS_TO_REMOVE_VARIANTS_FROM.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,*puVar3);
    pmVar4 = Map::variants(pMVar2);
    __end2 = std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>
             ::begin(pmVar4);
    local_98._M_node =
         (_Base_ptr)
         std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::end
                   (pmVar4);
    while( true ) {
      bVar1 = std::operator==(&__end2,&local_98);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __in = std::_Rb_tree_iterator<std::pair<Map_*const,_Flag>_>::operator*(&__end2);
      ppMVar5 = std::get<0ul,Map*const,Flag>(__in);
      std::get<1ul,Map*const,Flag>(__in);
      Map::clear(*ppMVar5);
      std::_Rb_tree_iterator<std::pair<Map_*const,_Flag>_>::operator++(&__end2);
    }
    pmVar4 = Map::variants(pMVar2);
    std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::clear
              (pmVar4);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  return;
}

Assistant:

static void remove_useless_map_variants(World& world)
    {
        // Clear unreachable variants and prevent them from triggering
        const std::vector<uint16_t> MAPS_TO_REMOVE_VARIANTS_FROM = {
                MAP_THIEVES_HIDEOUT_TREASURE_ROOM,
                MAP_MERCATOR_CASTLE_THRONE_ROOM,
                MAP_MERCATOR_CASTLE_MAIN_HALL,
                MAP_MERCATOR_CASTLE_ENTRANCE_HALLWAY,
                MAP_MERCATOR_CASTLE_ARMORY_0F,
                MAP_MERCATOR_DOCKS_SUPPLY_SHOP,
                MAP_MERCATOR_CASTLE_2F_HALLWAY
        };

        world.map(MAP_MERCATOR_DOCKS_SUPPLY_SHOP)->map_setup_addr(0xFFFFFFFF);

        for(uint16_t map_id : MAPS_TO_REMOVE_VARIANTS_FROM)
        {
            Map* map = world.map(map_id);
            for(auto& [variant_map, flag] : map->variants())
                variant_map->clear();
            map->variants().clear();
        }
    }